

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
jessilib::parser_registration<test_parser>::parser_registration
          (parser_registration<test_parser> *this,string *in_format,bool in_force)

{
  undefined8 uVar1;
  id iVar2;
  undefined7 in_register_00000011;
  undefined8 in_R8;
  undefined8 in_R9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  uVar1 = jessilib::impl::parser_manager::instance();
  std::make_shared<test_parser>();
  a_Stack_40[0]._M_pi = _Stack_50._M_pi;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar2 = jessilib::impl::parser_manager::register_parser
                    (uVar1,local_48,in_format,CONCAT71(in_register_00000011,in_force) & 0xffffffff,
                     in_R8,in_R9,0);
  this->m_id = iVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  return;
}

Assistant:

parser_registration(std::string in_format, bool in_force = false) {
		m_id = impl::parser_manager::instance().register_parser(std::make_shared<T>(), in_format, in_force);
	}